

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

void T1_Done_Blend(T1_Face face)

{
  uint uVar1;
  PS_Blend pPVar2;
  FT_Memory memory;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  pPVar2 = face->blend;
  if (pPVar2 != (PS_Blend)0x0) {
    memory = (face->root).memory;
    uVar1 = pPVar2->num_designs;
    uVar5 = (ulong)uVar1;
    uVar4 = (ulong)pPVar2->num_axis;
    ft_mem_free(memory,pPVar2->design_pos[0]);
    pPVar2->design_pos[0] = (FT_Fixed *)0x0;
    if (1 < uVar5) {
      memset(pPVar2->design_pos + 1,0,(ulong)(uVar1 - 1) << 3);
    }
    ft_mem_free(memory,pPVar2->privates[1]);
    pPVar2->privates[1] = (PS_Private)0x0;
    ft_mem_free(memory,pPVar2->font_infos[1]);
    pPVar2->font_infos[1] = (PS_FontInfo)0x0;
    ft_mem_free(memory,pPVar2->bboxes[1]);
    pPVar2->bboxes[1] = (FT_BBox *)0x0;
    if (uVar5 != 0) {
      uVar3 = 0;
      do {
        pPVar2->privates[uVar3] = (PS_Private)0x0;
        pPVar2->font_infos[uVar3] = (PS_FontInfo)0x0;
        pPVar2->bboxes[uVar3] = (FT_BBox *)0x0;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    ft_mem_free(memory,pPVar2->weight_vector);
    pPVar2->weight_vector = (FT_Fixed *)0x0;
    pPVar2->default_weight_vector = (FT_Fixed *)0x0;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        ft_mem_free(memory,pPVar2->axis_names[uVar5]);
        pPVar2->axis_names[uVar5] = (FT_String *)0x0;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
      if (uVar4 != 0) {
        lVar6 = 0;
        do {
          ft_mem_free(memory,*(void **)((long)&pPVar2->design_map[0].design_points + lVar6));
          *(undefined8 *)((long)&pPVar2->design_map[0].design_points + lVar6) = 0;
          (&pPVar2->design_map[0].num_points)[lVar6] = '\0';
          lVar6 = lVar6 + 0x18;
        } while (uVar4 * 0x18 != lVar6);
      }
    }
    ft_mem_free(memory,face->blend);
    face->blend = (PS_Blend)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  T1_Done_Blend( T1_Face  face )
  {
    FT_Memory  memory = face->root.memory;
    PS_Blend   blend  = face->blend;


    if ( blend )
    {
      FT_UInt  num_designs = blend->num_designs;
      FT_UInt  num_axis    = blend->num_axis;
      FT_UInt  n;


      /* release design pos table */
      FT_FREE( blend->design_pos[0] );
      for ( n = 1; n < num_designs; n++ )
        blend->design_pos[n] = NULL;

      /* release blend `private' and `font info' dictionaries */
      FT_FREE( blend->privates[1] );
      FT_FREE( blend->font_infos[1] );
      FT_FREE( blend->bboxes[1] );

      for ( n = 0; n < num_designs; n++ )
      {
        blend->privates  [n] = NULL;
        blend->font_infos[n] = NULL;
        blend->bboxes    [n] = NULL;
      }

      /* release weight vectors */
      FT_FREE( blend->weight_vector );
      blend->default_weight_vector = NULL;

      /* release axis names */
      for ( n = 0; n < num_axis; n++ )
        FT_FREE( blend->axis_names[n] );

      /* release design map */
      for ( n = 0; n < num_axis; n++ )
      {
        PS_DesignMap  dmap = blend->design_map + n;


        FT_FREE( dmap->design_points );
        dmap->num_points = 0;
      }

      FT_FREE( face->blend );
    }
  }